

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_TimedTip(FParser *this)

{
  FFont *font;
  bool bVar1;
  int iVar2;
  char *msg;
  undefined1 local_20 [16];
  FParser *pFStack_10;
  float saved;
  FParser *this_local;
  
  pFStack_10 = this;
  bVar1 = CheckArgs(this,2);
  if (bVar1) {
    local_20._12_4_ = FFloatCVar::operator_cast_to_float(&con_midtime);
    iVar2 = intvalue(this->t_argv);
    FFloatCVar::operator=(&con_midtime,(float)iVar2 / 100.0);
    font = SmallFont;
    GetFormatString((FParser *)local_20,(int)this);
    msg = FString::GetChars((FString *)local_20);
    C_MidPrint(font,msg);
    FString::~FString((FString *)local_20);
    FFloatCVar::operator=(&con_midtime,(float)local_20._12_4_);
  }
  return;
}

Assistant:

void FParser::SF_TimedTip(void)
{
	if (CheckArgs(2))
	{
		float saved = con_midtime;
		con_midtime = intvalue(t_argv[0])/100.0f;
		C_MidPrint(SmallFont, GetFormatString(1).GetChars());
		con_midtime=saved;
	}
}